

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall cmDependsC::TransformLine(cmDependsC *this,string *line)

{
  RegularExpression *this_00;
  long lVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  iterator iVar4;
  _Base_ptr p_Var5;
  string newline;
  string arg;
  
  this_00 = &this->IncludeRegexTransform;
  bVar3 = cmsys::RegularExpression::find(this_00,line);
  if (bVar3) {
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&newline,&this_00->regmatch,3);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->TransformRules)._M_t,&newline);
    std::__cxx11::string::~string((string *)&newline);
    if ((_Rb_tree_header *)iVar4._M_node !=
        &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header) {
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&newline,&this_00->regmatch,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&arg,&this_00->regmatch,4);
      lVar1 = *(long *)(iVar4._M_node + 2);
      p_Var2 = iVar4._M_node[2]._M_parent;
      for (p_Var5 = (_Base_ptr)0x0; p_Var2 != p_Var5;
          p_Var5 = (_Base_ptr)((long)&p_Var5->_M_color + 1)) {
        if (*(char *)((long)&p_Var5->_M_color + lVar1) == '%') {
          std::__cxx11::string::append((string *)&newline);
        }
        else {
          std::__cxx11::string::push_back((char)&newline);
        }
      }
      std::__cxx11::string::_M_assign((string *)line);
      std::__cxx11::string::~string((string *)&arg);
      std::__cxx11::string::~string((string *)&newline);
    }
  }
  return;
}

Assistant:

void cmDependsC::TransformLine(std::string& line)
{
  // Check for a transform rule match.  Return if none.
  if (!this->IncludeRegexTransform.find(line)) {
    return;
  }
  TransformRulesType::const_iterator tri =
    this->TransformRules.find(this->IncludeRegexTransform.match(3));
  if (tri == this->TransformRules.end()) {
    return;
  }

  // Construct the transformed line.
  std::string newline = this->IncludeRegexTransform.match(1);
  std::string arg = this->IncludeRegexTransform.match(4);
  for (char c : tri->second) {
    if (c == '%') {
      newline += arg;
    } else {
      newline += c;
    }
  }

  // Return the transformed line.
  line = newline;
}